

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

void Pdr_QueueClean(Pdr_Man_t *p)

{
  Pdr_Obl_t *p_00;
  
  while( true ) {
    p_00 = p->pQueue;
    if (p_00 == (Pdr_Obl_t *)0x0) {
      p_00 = (Pdr_Obl_t *)0x0;
    }
    else {
      p->pQueue = p_00->pLink;
      Pdr_OblDeref(p_00);
      p->nQueCur = p->nQueCur + -1;
    }
    if (p_00 == (Pdr_Obl_t *)0x0) break;
    Pdr_OblDeref(p_00);
  }
  return;
}

Assistant:

void Pdr_QueueClean( Pdr_Man_t * p )
{
    Pdr_Obl_t * pThis;
    while ( (pThis = Pdr_QueuePop(p)) )
        Pdr_OblDeref( pThis );
    pThis = NULL;
}